

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lupica.c
# Opt level: O0

void print_instr(Emulator *e,Instr instr,_Bool print_memory)

{
  char *__format;
  InstrFormat IVar1;
  u16 uVar2;
  int iVar3;
  ulong uVar4;
  char *__s;
  anon_union_4_2_94730066_for_Instr_4 addr;
  bool bVar5;
  uint local_cc;
  char **ppcStack_c8;
  u32 val;
  char *p;
  int count;
  OpInfo op_info;
  char *bufp;
  char buf [100];
  _Bool print_memory_local;
  Emulator *e_local;
  Op local_18;
  byte bStack_14;
  byte bStack_13;
  Instr instr_local;
  
  addr = instr.field_4;
  uVar4 = instr._0_8_ & 0xffffffff;
  __format = s_op_info[uVar4].fmt_str;
  IVar1 = s_op_info[uVar4].format;
  buf[0x5f] = print_memory;
  unique0x1000037c = e;
  iVar3 = snprintf((char *)&bufp,(size_t)(buf + (0x5c - (long)&bufp)),"\x1b[32m%s\x1b[37m ",
                   s_op_info[uVar4].op_str);
  __s = (char *)((long)&bufp + (long)iVar3);
  bStack_14 = instr.n;
  bStack_13 = instr.m;
  switch(IVar1) {
  case FORMAT_0:
    break;
  case FORMAT_M:
    snprintf(__s,100 - ((long)__s - (long)&bufp),__format,(ulong)bStack_13);
    break;
  case FORMAT_N:
    snprintf(__s,100 - ((long)__s - (long)&bufp),__format,(ulong)bStack_14);
    break;
  case FORMAT_NM:
    snprintf(__s,100 - ((long)__s - (long)&bufp),__format,(ulong)bStack_13,(ulong)bStack_14);
    break;
  case FORMAT_MD:
    snprintf(__s,100 - ((long)__s - (long)&bufp),__format,(ulong)addr.d,(ulong)bStack_13);
    break;
  case FORMAT_ND4:
  case FORMAT_ND8:
    snprintf(__s,100 - ((long)__s - (long)&bufp),__format,(ulong)addr.d,(ulong)bStack_14);
    break;
  case FORMAT_NMD:
    snprintf(__s,100 - ((long)__s - (long)&bufp),__format,(ulong)bStack_13,(ulong)addr.d,
             (ulong)bStack_14);
    break;
  case FORMAT_D:
  case FORMAT_D12:
    snprintf(__s,100 - ((long)__s - (long)&bufp),__format,(ulong)addr.d);
    break;
  case FORMAT_I:
    snprintf(__s,100 - ((long)__s - (long)&bufp),__format,(ulong)addr.d);
    break;
  case FORMAT_NI:
    snprintf(__s,100 - ((long)__s - (long)&bufp),__format,(ulong)addr.d,(ulong)bStack_14);
  }
  p._4_4_ = 0;
  for (ppcStack_c8 = &bufp; *(char *)ppcStack_c8 != '\0';
      ppcStack_c8 = (char **)((long)ppcStack_c8 + 1)) {
    if (*(char *)ppcStack_c8 == '\x1b') {
      while( true ) {
        bVar5 = false;
        if (*(char *)ppcStack_c8 != '\0') {
          bVar5 = *(char *)ppcStack_c8 != 'm';
        }
        if (!bVar5) break;
        ppcStack_c8 = (char **)((long)ppcStack_c8 + 1);
      }
    }
    else {
      p._4_4_ = p._4_4_ + 1;
    }
  }
  printf("%s%*s",&bufp,(ulong)(0x1e - p._4_4_),"");
  if (((buf[0x5f] & 1U) != 0) &&
     (((local_18 = instr.op, IVar1 == FORMAT_D && (local_18 == MOVA_A_D_PC_R0)) ||
      (IVar1 == FORMAT_ND8)))) {
    if (local_18 == MOVW_A_D_PC_RN) {
      uVar2 = read_u16(stack0xffffffffffffffd0,addr.d);
      local_cc = (uint)(short)uVar2;
    }
    else {
      local_cc = read_u32(stack0xffffffffffffffd0,addr.d);
    }
    printf("; 0x%08x",(ulong)local_cc);
  }
  return;
}

Assistant:

void print_instr(Emulator* e, Instr instr, bool print_memory) {
  char buf[100];
  char* bufp = buf;

#define SNCAT(...) \
  bufp += snprintf(bufp, sizeof(buf) - (bufp - buf), __VA_ARGS__)

  OpInfo op_info = s_op_info[instr.op];
  SNCAT(GREEN "%s" WHITE " ", op_info.op_str);

  // clang-format off
  switch (op_info.format) {
    case FORMAT_0: break;
    case FORMAT_M: SNCAT(op_info.fmt_str, instr.m); break;
    case FORMAT_N: SNCAT(op_info.fmt_str, instr.n); break;
    case FORMAT_NM: SNCAT(op_info.fmt_str, instr.m, instr.n); break;
    case FORMAT_MD: SNCAT(op_info.fmt_str, instr.d, instr.m); break;
    case FORMAT_NMD: SNCAT(op_info.fmt_str, instr.m, instr.d, instr.n); break;
    case FORMAT_D:
    case FORMAT_D12: SNCAT(op_info.fmt_str, instr.d); break;
    case FORMAT_ND4:
    case FORMAT_ND8: SNCAT(op_info.fmt_str, instr.d, instr.n); break;
    case FORMAT_I: SNCAT(op_info.fmt_str, instr.i); break;
    case FORMAT_NI: SNCAT(op_info.fmt_str, instr.i, instr.n); break;
  }
  // clang-format on

#undef SNCAT

  /* Count the length of the instruction, skipping color escape codes. */
  int count = 0;
  const char* p;
  for (p = buf; *p; ++p) {
    if (*p == '\x1b') {
      while (*p && *p != 'm') p++;
    } else {
      ++count;
    }
  }

  /* Pad out the instruction with spaces, so whatever follows is aligned. */
  printf("%s%*s", buf, INSTR_COLUMNS - count, "");

  if (print_memory) {
    if ((op_info.format == FORMAT_D && instr.op == MOVA_A_D_PC_R0) ||
        (op_info.format == FORMAT_ND8)) {
      /* PC relative memory access */
      u32 val;
      if (instr.op == MOVW_A_D_PC_RN) {
        val = SIGN_EXTEND(read_u16(e, instr.d), 16);
      } else {
        val = read_u32(e, instr.d);
      }
      printf("; 0x%08x", val);
    }
  }
}